

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void load_buffer_4x4(int16_t *input,__m128i *in,int stride,int flipud,int fliplr,int shift)

{
  __m128i alVar1;
  undefined1 auVar2 [16];
  __m128i alVar3;
  undefined1 auVar4 [16];
  __m128i alVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  if (flipud == 0) {
    alVar1[1] = 0;
    alVar1[0] = *(ulong *)input;
    *in = alVar1;
    alVar3[1] = 0;
    alVar3[0] = *(ulong *)(input + stride);
    in[1] = alVar3;
    alVar5[1] = 0;
    alVar5[0] = *(ulong *)(input + stride * 2);
    in[2] = alVar5;
    input = input + stride * 3;
  }
  else {
    alVar1[1] = 0;
    alVar1[0] = *(ulong *)(input + stride * 3);
    *in = alVar1;
    alVar3[1] = 0;
    alVar3[0] = *(ulong *)(input + stride * 2);
    in[1] = alVar3;
    alVar5[1] = 0;
    alVar5[0] = *(ulong *)(input + stride);
    in[2] = alVar5;
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)input;
  if (fliplr != 0) {
    alVar1 = (__m128i)pshuflw((undefined1  [16])alVar1,(undefined1  [16])alVar1,0x1b);
    alVar3 = (__m128i)pshuflw((undefined1  [16])alVar3,(undefined1  [16])alVar3,0x1b);
    alVar5 = (__m128i)pshuflw((undefined1  [16])alVar5,(undefined1  [16])alVar5,0x1b);
    auVar7 = pshuflw(auVar7,auVar7,0x1b);
  }
  auVar2 = pmovsxwd((undefined1  [16])alVar1,(undefined1  [16])alVar1);
  auVar4 = pmovsxwd((undefined1  [16])alVar3,(undefined1  [16])alVar3);
  auVar6 = pmovsxwd((undefined1  [16])alVar5,(undefined1  [16])alVar5);
  auVar7 = pmovsxwd(auVar7,auVar7);
  *(int *)*in = auVar2._0_4_ << shift;
  *(int *)((long)*in + 4) = auVar2._4_4_;
  *(int *)(*in + 1) = auVar2._8_4_;
  *(int *)((long)*in + 0xc) = auVar2._12_4_;
  *(int *)in[1] = auVar4._0_4_ << shift;
  *(int *)((long)in[1] + 4) = auVar4._4_4_;
  *(int *)(in[1] + 1) = auVar4._8_4_;
  *(int *)((long)in[1] + 0xc) = auVar4._12_4_;
  *(int *)in[2] = auVar6._0_4_ << shift;
  *(int *)((long)in[2] + 4) = auVar6._4_4_;
  *(int *)(in[2] + 1) = auVar6._8_4_;
  *(int *)((long)in[2] + 0xc) = auVar6._12_4_;
  *(int *)in[3] = auVar7._0_4_ << shift;
  *(int *)((long)in[3] + 4) = auVar7._4_4_;
  *(int *)(in[3] + 1) = auVar7._8_4_;
  *(int *)((long)in[3] + 0xc) = auVar7._12_4_;
  return;
}

Assistant:

static inline void load_buffer_4x4(const int16_t *input, __m128i *in,
                                   int stride, int flipud, int fliplr,
                                   int shift) {
  if (!flipud) {
    in[0] = _mm_loadl_epi64((const __m128i *)(input + 0 * stride));
    in[1] = _mm_loadl_epi64((const __m128i *)(input + 1 * stride));
    in[2] = _mm_loadl_epi64((const __m128i *)(input + 2 * stride));
    in[3] = _mm_loadl_epi64((const __m128i *)(input + 3 * stride));
  } else {
    in[0] = _mm_loadl_epi64((const __m128i *)(input + 3 * stride));
    in[1] = _mm_loadl_epi64((const __m128i *)(input + 2 * stride));
    in[2] = _mm_loadl_epi64((const __m128i *)(input + 1 * stride));
    in[3] = _mm_loadl_epi64((const __m128i *)(input + 0 * stride));
  }

  if (fliplr) {
    in[0] = _mm_shufflelo_epi16(in[0], 0x1b);
    in[1] = _mm_shufflelo_epi16(in[1], 0x1b);
    in[2] = _mm_shufflelo_epi16(in[2], 0x1b);
    in[3] = _mm_shufflelo_epi16(in[3], 0x1b);
  }

  in[0] = _mm_cvtepi16_epi32(in[0]);
  in[1] = _mm_cvtepi16_epi32(in[1]);
  in[2] = _mm_cvtepi16_epi32(in[2]);
  in[3] = _mm_cvtepi16_epi32(in[3]);

  in[0] = _mm_slli_epi32(in[0], shift);
  in[1] = _mm_slli_epi32(in[1], shift);
  in[2] = _mm_slli_epi32(in[2], shift);
  in[3] = _mm_slli_epi32(in[3], shift);
}